

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

cmValue __thiscall
cmGeneratorTarget::GetPropertyWithPairedLanguageSupport
          (cmGeneratorTarget *this,string *lang,char *suffix)

{
  cmTarget *this_00;
  bool bVar1;
  allocator<char> local_b1;
  string local_b0;
  string *local_90;
  allocator<char> local_81;
  string local_80;
  string *local_60;
  string local_48;
  char *local_28;
  char *suffix_local;
  string *lang_local;
  cmGeneratorTarget *this_local;
  cmValue propertyValue;
  
  this_00 = this->Target;
  local_28 = suffix;
  suffix_local = (char *)lang;
  lang_local = (string *)this;
  cmStrCat<std::__cxx11::string_const&,char_const*&>(&local_48,lang,&local_28);
  this_local = (cmGeneratorTarget *)cmTarget::GetProperty(this_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)&this_local);
  if (!bVar1) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            suffix_local,"OBJC");
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"C",&local_81);
      local_60 = (string *)GetPropertyWithPairedLanguageSupport(this,&local_80,local_28);
      this_local = (cmGeneratorTarget *)local_60;
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator(&local_81);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              suffix_local,"OBJCXX");
      if (((bVar1) ||
          (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)suffix_local,"CUDA"), bVar1)) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)suffix_local,"HIP"), bVar1)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"CXX",&local_b1);
        local_90 = (string *)GetPropertyWithPairedLanguageSupport(this,&local_b0,local_28);
        this_local = (cmGeneratorTarget *)local_90;
        std::__cxx11::string::~string((string *)&local_b0);
        std::allocator<char>::~allocator(&local_b1);
      }
    }
  }
  return (cmValue)(string *)this_local;
}

Assistant:

cmValue cmGeneratorTarget::GetPropertyWithPairedLanguageSupport(
  std::string const& lang, const char* suffix) const
{
  cmValue propertyValue = this->Target->GetProperty(cmStrCat(lang, suffix));
  if (!propertyValue) {
    // Check if we should use the value set by another language.
    if (lang == "OBJC") {
      propertyValue = this->GetPropertyWithPairedLanguageSupport("C", suffix);
    } else if (lang == "OBJCXX" || lang == "CUDA" || lang == "HIP") {
      propertyValue =
        this->GetPropertyWithPairedLanguageSupport("CXX", suffix);
    }
  }
  return propertyValue;
}